

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

void REVstone_add_split_target_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CMFormat format;
  EV_void_response response;
  undefined1 local_24 [4];
  
  format = CMlookup_format(conn->cm,EV_void_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_void_response_formats);
  }
  EVstone_add_split_target(cm,*(EVstone *)((long)data + 4),*(EVstone *)((long)data + 8));
  CMwrite(conn,format,local_24);
  return;
}

Assistant:

static void
REVstone_add_split_target_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_void_response response;
    EVstone_add_split_target_request *request = (EVstone_add_split_target_request *) data;
    CMFormat f = CMlookup_format(conn->cm, EV_void_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_void_response_formats);
    }
    EVstone_add_split_target(cm, request->stone, request->target_stone);
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}